

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexBuckets
          (DWARFVerifier *this,NameIndex *NI,DataExtractor *StrData)

{
  reference Vals_1;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  raw_ostream *prVar4;
  uint *puVar5;
  StringRef local_3a0;
  uint32_t local_38c;
  uint64_t local_388;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
  local_380;
  StringRef local_2f0;
  NameTableEntry local_2e0;
  char *local_2b0;
  char *Str;
  uint32_t Hash;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
  local_298;
  uint32_t local_214;
  uint32_t local_210;
  uint32_t FirstHash;
  uint32_t Idx;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
  local_200;
  reference local_190;
  BucketInfo *B;
  iterator __end1;
  iterator __begin1;
  vector<BucketInfo,_std::allocator<BucketInfo>_> *__range1;
  uint local_168;
  uint32_t NextUncovered;
  BucketInfo *local_160;
  __normal_iterator<BucketInfo_*,_std::vector<BucketInfo,_std::allocator<BucketInfo>_>_> local_158;
  undefined4 local_150;
  uint32_t local_14c;
  uint64_t local_148;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
  local_140;
  uint32_t local_bc;
  uint local_b8;
  uint32_t Index;
  uint32_t End;
  uint32_t Bucket;
  vector<BucketInfo,_std::allocator<BucketInfo>_> BucketStarts;
  uint64_t local_88;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_> local_80;
  uint local_2c;
  DataExtractor *pDStack_28;
  uint32_t NumErrors;
  DataExtractor *StrData_local;
  NameIndex *NI_local;
  DWARFVerifier *this_local;
  
  local_2c = 0;
  pDStack_28 = StrData;
  StrData_local = (DataExtractor *)NI;
  NI_local = (NameIndex *)this;
  uVar2 = DWARFDebugNames::NameIndex::getBucketCount(NI);
  if (uVar2 == 0) {
    prVar4 = warn(this);
    local_88 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)StrData_local);
    formatv<unsigned_long>
              (&local_80,"Name Index @ {0:x} does not contain a hash table.\n",&local_88);
    raw_ostream::operator<<(prVar4,&local_80.super_formatv_object_base);
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
    ~formatv_object(&local_80);
    this_local._4_4_ = local_2c;
  }
  else {
    std::vector<BucketInfo,_std::allocator<BucketInfo>_>::vector
              ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&End);
    uVar2 = DWARFDebugNames::NameIndex::getBucketCount((NameIndex *)StrData_local);
    std::vector<BucketInfo,_std::allocator<BucketInfo>_>::reserve
              ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&End,(ulong)(uVar2 + 1));
    Index = 0;
    local_b8 = DWARFDebugNames::NameIndex::getBucketCount((NameIndex *)StrData_local);
    for (; Index < local_b8; Index = Index + 1) {
      uVar2 = DWARFDebugNames::NameIndex::getBucketArrayEntry((NameIndex *)StrData_local,Index);
      local_bc = uVar2;
      uVar3 = DWARFDebugNames::NameIndex::getNameCount((NameIndex *)StrData_local);
      if (uVar3 < uVar2) {
        prVar4 = error(this);
        local_148 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)StrData_local);
        local_14c = DWARFDebugNames::NameIndex::getNameCount((NameIndex *)StrData_local);
        formatv<unsigned_int_&,_unsigned_long,_unsigned_int_&,_unsigned_int>
                  (&local_140,
                   "Bucket {0} of Name Index @ {1:x} contains invalid value {2}. Valid range is [0, {3}].\n"
                   ,&Index,&local_148,&local_bc,&local_14c);
        raw_ostream::operator<<(prVar4,&local_140.super_formatv_object_base);
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
        ::~formatv_object(&local_140);
        local_2c = local_2c + 1;
      }
      else if (local_bc != 0) {
        std::
        vector<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo,std::allocator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>>
        ::emplace_back<unsigned_int&,unsigned_int&>
                  ((vector<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo,std::allocator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>>
                    *)&End,&Index,&local_bc);
      }
    }
    if (local_2c == 0) {
      local_158._M_current =
           (BucketInfo *)
           std::vector<BucketInfo,_std::allocator<BucketInfo>_>::begin
                     ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&End);
      local_160 = (BucketInfo *)
                  std::vector<BucketInfo,_std::allocator<BucketInfo>_>::end
                            ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&End);
      array_pod_sort<__gnu_cxx::__normal_iterator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo*,std::vector<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo,std::allocator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>>>>
                (local_158,
                 (__normal_iterator<BucketInfo_*,_std::vector<BucketInfo,_std::allocator<BucketInfo>_>_>
                  )local_160);
      NextUncovered = DWARFDebugNames::NameIndex::getBucketCount((NameIndex *)StrData_local);
      uVar2 = DWARFDebugNames::NameIndex::getNameCount((NameIndex *)StrData_local);
      local_168 = uVar2 + 1;
      std::
      vector<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo,std::allocator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>>
      ::emplace_back<unsigned_int,unsigned_int>
                ((vector<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo,std::allocator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>>
                  *)&End,&NextUncovered,&local_168);
      __range1._4_4_ = 1;
      __end1 = std::vector<BucketInfo,_std::allocator<BucketInfo>_>::begin
                         ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&End);
      B = (BucketInfo *)
          std::vector<BucketInfo,_std::allocator<BucketInfo>_>::end
                    ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&End);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<BucketInfo_*,_std::vector<BucketInfo,_std::allocator<BucketInfo>_>_>
                                         *)&B), bVar1) {
        local_190 = __gnu_cxx::
                    __normal_iterator<BucketInfo_*,_std::vector<BucketInfo,_std::allocator<BucketInfo>_>_>
                    ::operator*(&__end1);
        if (__range1._4_4_ < local_190->Index) {
          prVar4 = error(this);
          _Idx = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)StrData_local);
          FirstHash = local_190->Index - 1;
          formatv<unsigned_long,_unsigned_int_&,_unsigned_int>
                    (&local_200,
                     "Name Index @ {0:x}: Name table entries [{1}, {2}] are not covered by the hash table.\n"
                     ,(unsigned_long *)&Idx,(uint *)((long)&__range1 + 4),&FirstHash);
          raw_ostream::operator<<(prVar4,&local_200.super_formatv_object_base);
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
          ::~formatv_object(&local_200);
          local_2c = local_2c + 1;
        }
        local_210 = local_190->Index;
        uVar2 = local_190->Bucket;
        uVar3 = DWARFDebugNames::NameIndex::getBucketCount((NameIndex *)StrData_local);
        if (uVar2 == uVar3) break;
        uVar2 = DWARFDebugNames::NameIndex::getHashArrayEntry((NameIndex *)StrData_local,local_210);
        local_214 = uVar2;
        uVar3 = DWARFDebugNames::NameIndex::getBucketCount((NameIndex *)StrData_local);
        if (uVar2 % uVar3 != local_190->Bucket) {
          prVar4 = error(this);
          _Hash = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)StrData_local);
          Vals_1 = local_190;
          uVar2 = local_214;
          uVar3 = DWARFDebugNames::NameIndex::getBucketCount((NameIndex *)StrData_local);
          Str._4_4_ = uVar2 % uVar3;
          formatv<unsigned_long,_const_unsigned_int_&,_unsigned_int_&,_unsigned_int>
                    (&local_298,
                     "Name Index @ {0:x}: Bucket {1} is not empty but points to a mismatched hash value {2:x} (belonging to bucket {3}).\n"
                     ,(unsigned_long *)&Hash,&Vals_1->Bucket,&local_214,(uint *)((long)&Str + 4));
          raw_ostream::operator<<(prVar4,&local_298.super_formatv_object_base);
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
          ::~formatv_object(&local_298);
          local_2c = local_2c + 1;
        }
        for (; uVar2 = local_210,
            uVar3 = DWARFDebugNames::NameIndex::getNameCount((NameIndex *)StrData_local),
            uVar2 <= uVar3; local_210 = local_210 + 1) {
          uVar2 = DWARFDebugNames::NameIndex::getHashArrayEntry
                            ((NameIndex *)StrData_local,local_210);
          Str._0_4_ = uVar2;
          uVar3 = DWARFDebugNames::NameIndex::getBucketCount((NameIndex *)StrData_local);
          if (uVar2 % uVar3 != local_190->Bucket) break;
          DWARFDebugNames::NameIndex::getNameTableEntry
                    (&local_2e0,(NameIndex *)StrData_local,local_210);
          local_2b0 = DWARFDebugNames::NameTableEntry::getString(&local_2e0);
          StringRef::StringRef(&local_2f0,local_2b0);
          uVar2 = caseFoldingDjbHash(local_2f0,0x1505);
          if (uVar2 != (uint32_t)Str) {
            prVar4 = error(this);
            local_388 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)StrData_local);
            StringRef::StringRef(&local_3a0,local_2b0);
            local_38c = caseFoldingDjbHash(local_3a0,0x1505);
            formatv<unsigned_long,_const_char_*&,_unsigned_int_&,_unsigned_int,_unsigned_int_&>
                      (&local_380,
                       "Name Index @ {0:x}: String ({1}) at index {2} hashes to {3:x}, but the Name Index hash is {4:x}\n"
                       ,&local_388,&local_2b0,&local_210,&local_38c,(uint *)&Str);
            raw_ostream::operator<<(prVar4,&local_380.super_formatv_object_base);
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
            ::~formatv_object(&local_380);
            local_2c = local_2c + 1;
          }
        }
        puVar5 = std::max<unsigned_int>((uint *)((long)&__range1 + 4),&local_210);
        __range1._4_4_ = *puVar5;
        __gnu_cxx::
        __normal_iterator<BucketInfo_*,_std::vector<BucketInfo,_std::allocator<BucketInfo>_>_>::
        operator++(&__end1);
      }
    }
    local_150 = 1;
    this_local._4_4_ = local_2c;
    std::vector<BucketInfo,_std::allocator<BucketInfo>_>::~vector
              ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&End);
  }
  return this_local._4_4_;
}

Assistant:

unsigned
DWARFVerifier::verifyNameIndexBuckets(const DWARFDebugNames::NameIndex &NI,
                                      const DataExtractor &StrData) {
  struct BucketInfo {
    uint32_t Bucket;
    uint32_t Index;

    constexpr BucketInfo(uint32_t Bucket, uint32_t Index)
        : Bucket(Bucket), Index(Index) {}
    bool operator<(const BucketInfo &RHS) const { return Index < RHS.Index; };
  };

  uint32_t NumErrors = 0;
  if (NI.getBucketCount() == 0) {
    warn() << formatv("Name Index @ {0:x} does not contain a hash table.\n",
                      NI.getUnitOffset());
    return NumErrors;
  }

  // Build up a list of (Bucket, Index) pairs. We use this later to verify that
  // each Name is reachable from the appropriate bucket.
  std::vector<BucketInfo> BucketStarts;
  BucketStarts.reserve(NI.getBucketCount() + 1);
  for (uint32_t Bucket = 0, End = NI.getBucketCount(); Bucket < End; ++Bucket) {
    uint32_t Index = NI.getBucketArrayEntry(Bucket);
    if (Index > NI.getNameCount()) {
      error() << formatv("Bucket {0} of Name Index @ {1:x} contains invalid "
                         "value {2}. Valid range is [0, {3}].\n",
                         Bucket, NI.getUnitOffset(), Index, NI.getNameCount());
      ++NumErrors;
      continue;
    }
    if (Index > 0)
      BucketStarts.emplace_back(Bucket, Index);
  }

  // If there were any buckets with invalid values, skip further checks as they
  // will likely produce many errors which will only confuse the actual root
  // problem.
  if (NumErrors > 0)
    return NumErrors;

  // Sort the list in the order of increasing "Index" entries.
  array_pod_sort(BucketStarts.begin(), BucketStarts.end());

  // Insert a sentinel entry at the end, so we can check that the end of the
  // table is covered in the loop below.
  BucketStarts.emplace_back(NI.getBucketCount(), NI.getNameCount() + 1);

  // Loop invariant: NextUncovered is the (1-based) index of the first Name
  // which is not reachable by any of the buckets we processed so far (and
  // hasn't been reported as uncovered).
  uint32_t NextUncovered = 1;
  for (const BucketInfo &B : BucketStarts) {
    // Under normal circumstances B.Index be equal to NextUncovered, but it can
    // be less if a bucket points to names which are already known to be in some
    // bucket we processed earlier. In that case, we won't trigger this error,
    // but report the mismatched hash value error instead. (We know the hash
    // will not match because we have already verified that the name's hash
    // puts it into the previous bucket.)
    if (B.Index > NextUncovered) {
      error() << formatv("Name Index @ {0:x}: Name table entries [{1}, {2}] "
                         "are not covered by the hash table.\n",
                         NI.getUnitOffset(), NextUncovered, B.Index - 1);
      ++NumErrors;
    }
    uint32_t Idx = B.Index;

    // The rest of the checks apply only to non-sentinel entries.
    if (B.Bucket == NI.getBucketCount())
      break;

    // This triggers if a non-empty bucket points to a name with a mismatched
    // hash. Clients are likely to interpret this as an empty bucket, because a
    // mismatched hash signals the end of a bucket, but if this is indeed an
    // empty bucket, the producer should have signalled this by marking the
    // bucket as empty.
    uint32_t FirstHash = NI.getHashArrayEntry(Idx);
    if (FirstHash % NI.getBucketCount() != B.Bucket) {
      error() << formatv(
          "Name Index @ {0:x}: Bucket {1} is not empty but points to a "
          "mismatched hash value {2:x} (belonging to bucket {3}).\n",
          NI.getUnitOffset(), B.Bucket, FirstHash,
          FirstHash % NI.getBucketCount());
      ++NumErrors;
    }

    // This find the end of this bucket and also verifies that all the hashes in
    // this bucket are correct by comparing the stored hashes to the ones we
    // compute ourselves.
    while (Idx <= NI.getNameCount()) {
      uint32_t Hash = NI.getHashArrayEntry(Idx);
      if (Hash % NI.getBucketCount() != B.Bucket)
        break;

      const char *Str = NI.getNameTableEntry(Idx).getString();
      if (caseFoldingDjbHash(Str) != Hash) {
        error() << formatv("Name Index @ {0:x}: String ({1}) at index {2} "
                           "hashes to {3:x}, but "
                           "the Name Index hash is {4:x}\n",
                           NI.getUnitOffset(), Str, Idx,
                           caseFoldingDjbHash(Str), Hash);
        ++NumErrors;
      }

      ++Idx;
    }
    NextUncovered = std::max(NextUncovered, Idx);
  }
  return NumErrors;
}